

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_init.cpp
# Opt level: O3

int ocl_init(void)

{
  OclLibrary pvVar1;
  int iVar2;
  
  iVar2 = 1;
  if (pfn_clGetPlatformIDs == (p_pfn_clGetPlatformIDs)0x0) {
    pvVar1 = oclLoadLibrary();
    if (pvVar1 == (OclLibrary)0x0) {
      iVar2 = 0;
    }
    else {
      pfn_clGetPlatformIDs = (p_pfn_clGetPlatformIDs)dlsym(pvVar1,"clGetPlatformIDs");
      pfn_clGetPlatformInfo = (p_pfn_clGetPlatformInfo)dlsym(pvVar1,"clGetPlatformInfo");
      pfn_clGetDeviceIDs = (p_pfn_clGetDeviceIDs)dlsym(pvVar1,"clGetDeviceIDs");
      pfn_clGetDeviceInfo = (p_pfn_clGetDeviceInfo)dlsym(pvVar1,"clGetDeviceInfo");
      pfn_clCreateContext = (p_pfn_clCreateContext)dlsym(pvVar1,"clCreateContext");
      pfn_clCreateContextFromType =
           (p_pfn_clCreateContextFromType)dlsym(pvVar1,"clCreateContextFromType");
      pfn_clRetainContext = (p_pfn_clRetainContext)dlsym(pvVar1,"clRetainContext");
      pfn_clReleaseContext = (p_pfn_clReleaseContext)dlsym(pvVar1,"clReleaseContext");
      pfn_clGetContextInfo = (p_pfn_clGetContextInfo)dlsym(pvVar1,"clGetContextInfo");
      pfn_clCreateCommandQueue = (p_pfn_clCreateCommandQueue)dlsym(pvVar1,"clCreateCommandQueue");
      pfn_clRetainCommandQueue = (p_pfn_clRetainCommandQueue)dlsym(pvVar1,"clRetainCommandQueue");
      pfn_clReleaseCommandQueue = (p_pfn_clReleaseCommandQueue)dlsym(pvVar1,"clReleaseCommandQueue")
      ;
      pfn_clGetCommandQueueInfo = (p_pfn_clGetCommandQueueInfo)dlsym(pvVar1,"clGetCommandQueueInfo")
      ;
      pfn_clSetCommandQueueProperty =
           (p_pfn_clSetCommandQueueProperty)dlsym(pvVar1,"clSetCommandQueueProperty");
      pfn_clCreateBuffer = (p_pfn_clCreateBuffer)dlsym(pvVar1,"clCreateBuffer");
      pfn_clCreateImage2D = (p_pfn_clCreateImage2D)dlsym(pvVar1,"clCreateImage2D");
      pfn_clCreateImage3D = (p_pfn_clCreateImage3D)dlsym(pvVar1,"clCreateImage3D");
      pfn_clRetainMemObject = (p_pfn_clRetainMemObject)dlsym(pvVar1,"clRetainMemObject");
      pfn_clReleaseMemObject = (p_pfn_clReleaseMemObject)dlsym(pvVar1,"clReleaseMemObject");
      pfn_clGetSupportedImageFormats =
           (p_pfn_clGetSupportedImageFormats)dlsym(pvVar1,"clGetSupportedImageFormats");
      pfn_clGetMemObjectInfo = (p_pfn_clGetMemObjectInfo)dlsym(pvVar1,"clGetMemObjectInfo");
      pfn_clGetImageInfo = (p_pfn_clGetImageInfo)dlsym(pvVar1,"clGetImageInfo");
      pfn_clCreateSampler = (p_pfn_clCreateSampler)dlsym(pvVar1,"clCreateSampler");
      pfn_clRetainSampler = (p_pfn_clRetainSampler)dlsym(pvVar1,"clRetainSampler");
      pfn_clReleaseSampler = (p_pfn_clReleaseSampler)dlsym(pvVar1,"clReleaseSampler");
      pfn_clGetSamplerInfo = (p_pfn_clGetSamplerInfo)dlsym(pvVar1,"clGetSamplerInfo");
      pfn_clCreateProgramWithSource =
           (p_pfn_clCreateProgramWithSource)dlsym(pvVar1,"clCreateProgramWithSource");
      pfn_clCreateProgramWithBinary =
           (p_pfn_clCreateProgramWithBinary)dlsym(pvVar1,"clCreateProgramWithBinary");
      pfn_clRetainProgram = (p_pfn_clRetainProgram)dlsym(pvVar1,"clRetainProgram");
      pfn_clReleaseProgram = (p_pfn_clReleaseProgram)dlsym(pvVar1,"clReleaseProgram");
      pfn_clBuildProgram = (p_pfn_clBuildProgram)dlsym(pvVar1,"clBuildProgram");
      pfn_clUnloadCompiler = (p_pfn_clUnloadCompiler)dlsym(pvVar1,"clUnloadCompiler");
      pfn_clGetProgramInfo = (p_pfn_clGetProgramInfo)dlsym(pvVar1,"clGetProgramInfo");
      pfn_clGetProgramBuildInfo = (p_pfn_clGetProgramBuildInfo)dlsym(pvVar1,"clGetProgramBuildInfo")
      ;
      pfn_clCreateKernel = (p_pfn_clCreateKernel)dlsym(pvVar1,"clCreateKernel");
      pfn_clCreateKernelsInProgram =
           (p_pfn_clCreateKernelsInProgram)dlsym(pvVar1,"clCreateKernelsInProgram");
      pfn_clRetainKernel = (p_pfn_clRetainKernel)dlsym(pvVar1,"clRetainKernel");
      pfn_clReleaseKernel = (p_pfn_clReleaseKernel)dlsym(pvVar1,"clReleaseKernel");
      pfn_clSetKernelArg = (p_pfn_clSetKernelArg)dlsym(pvVar1,"clSetKernelArg");
      pfn_clGetKernelInfo = (p_pfn_clGetKernelInfo)dlsym(pvVar1,"clGetKernelInfo");
      pfn_clGetKernelWorkGroupInfo =
           (p_pfn_clGetKernelWorkGroupInfo)dlsym(pvVar1,"clGetKernelWorkGroupInfo");
      pfn_clWaitForEvents = (p_pfn_clWaitForEvents)dlsym(pvVar1,"clWaitForEvents");
      pfn_clGetEventInfo = (p_pfn_clGetEventInfo)dlsym(pvVar1,"clGetEventInfo");
      pfn_clRetainEvent = (p_pfn_clRetainEvent)dlsym(pvVar1,"clRetainEvent");
      pfn_clReleaseEvent = (p_pfn_clReleaseEvent)dlsym(pvVar1,"clReleaseEvent");
      pfn_clGetEventProfilingInfo =
           (p_pfn_clGetEventProfilingInfo)dlsym(pvVar1,"clGetEventProfilingInfo");
      pfn_clFlush = (p_pfn_clFlush)dlsym(pvVar1,"clFlush");
      pfn_clFinish = (p_pfn_clFinish)dlsym(pvVar1,"clFinish");
      pfn_clEnqueueReadBuffer = (p_pfn_clEnqueueReadBuffer)dlsym(pvVar1,"clEnqueueReadBuffer");
      pfn_clEnqueueReadBufferRect =
           (p_pfn_clEnqueueReadBufferRect)dlsym(pvVar1,"clEnqueueReadBufferRect");
      pfn_clEnqueueWriteBuffer = (p_pfn_clEnqueueWriteBuffer)dlsym(pvVar1,"clEnqueueWriteBuffer");
      pfn_clEnqueueWriteBufferRect =
           (p_pfn_clEnqueueWriteBufferRect)dlsym(pvVar1,"clEnqueueWriteBufferRect");
      pfn_clEnqueueCopyBuffer = (p_pfn_clEnqueueCopyBuffer)dlsym(pvVar1,"clEnqueueCopyBuffer");
      pfn_clEnqueueReadImage = (p_pfn_clEnqueueReadImage)dlsym(pvVar1,"clEnqueueReadImage");
      pfn_clEnqueueWriteImage = (p_pfn_clEnqueueWriteImage)dlsym(pvVar1,"clEnqueueWriteImage");
      pfn_clEnqueueCopyImage = (p_pfn_clEnqueueCopyImage)dlsym(pvVar1,"clEnqueueCopyImage");
      pfn_clEnqueueCopyImageToBuffer =
           (p_pfn_clEnqueueCopyImageToBuffer)dlsym(pvVar1,"clEnqueueCopyImageToBuffer");
      pfn_clEnqueueCopyBufferToImage =
           (p_pfn_clEnqueueCopyBufferToImage)dlsym(pvVar1,"clEnqueueCopyBufferToImage");
      pfn_clEnqueueMapBuffer = (p_pfn_clEnqueueMapBuffer)dlsym(pvVar1,"clEnqueueMapBuffer");
      pfn_clEnqueueMapImage = (p_pfn_clEnqueueMapImage)dlsym(pvVar1,"clEnqueueMapImage");
      pfn_clEnqueueUnmapMemObject =
           (p_pfn_clEnqueueUnmapMemObject)dlsym(pvVar1,"clEnqueueUnmapMemObject");
      pfn_clEnqueueNDRangeKernel =
           (p_pfn_clEnqueueNDRangeKernel)dlsym(pvVar1,"clEnqueueNDRangeKernel");
      pfn_clEnqueueTask = (p_pfn_clEnqueueTask)dlsym(pvVar1,"clEnqueueTask");
      pfn_clEnqueueNativeKernel = (p_pfn_clEnqueueNativeKernel)dlsym(pvVar1,"clEnqueueNativeKernel")
      ;
      pfn_clEnqueueMarker = (p_pfn_clEnqueueMarker)dlsym(pvVar1,"clEnqueueMarker");
      pfn_clEnqueueWaitForEvents =
           (p_pfn_clEnqueueWaitForEvents)dlsym(pvVar1,"clEnqueueWaitForEvents");
      pfn_clEnqueueBarrier = (p_pfn_clEnqueueBarrier)dlsym(pvVar1,"clEnqueueBarrier");
      pfn_clGetExtensionFunctionAddress =
           (p_pfn_clGetExtensionFunctionAddress)dlsym(pvVar1,"clGetExtensionFunctionAddress");
    }
  }
  return iVar2;
}

Assistant:

int ocl_init(void)
{
	if (pfn_clGetPlatformIDs) return 1;

	OclLibrary lib = oclLoadLibrary();
	if (!lib) return 0;

	pfn_clGetPlatformIDs				= (p_pfn_clGetPlatformIDs)				oclGetProcAddress(lib, "clGetPlatformIDs");
	pfn_clGetPlatformInfo				= (p_pfn_clGetPlatformInfo)				oclGetProcAddress(lib, "clGetPlatformInfo");
	pfn_clGetDeviceIDs					= (p_pfn_clGetDeviceIDs)				oclGetProcAddress(lib, "clGetDeviceIDs");
	pfn_clGetDeviceInfo					= (p_pfn_clGetDeviceInfo)				oclGetProcAddress(lib, "clGetDeviceInfo");
	pfn_clCreateContext					= (p_pfn_clCreateContext)				oclGetProcAddress(lib, "clCreateContext");
	pfn_clCreateContextFromType			= (p_pfn_clCreateContextFromType)		oclGetProcAddress(lib, "clCreateContextFromType");
	pfn_clRetainContext					= (p_pfn_clRetainContext)				oclGetProcAddress(lib, "clRetainContext");
	pfn_clReleaseContext				= (p_pfn_clReleaseContext)				oclGetProcAddress(lib, "clReleaseContext");
	pfn_clGetContextInfo				= (p_pfn_clGetContextInfo)				oclGetProcAddress(lib, "clGetContextInfo");
	pfn_clCreateCommandQueue			= (p_pfn_clCreateCommandQueue)			oclGetProcAddress(lib, "clCreateCommandQueue");
	pfn_clRetainCommandQueue			= (p_pfn_clRetainCommandQueue)			oclGetProcAddress(lib, "clRetainCommandQueue");
	pfn_clReleaseCommandQueue			= (p_pfn_clReleaseCommandQueue)			oclGetProcAddress(lib, "clReleaseCommandQueue");
	pfn_clGetCommandQueueInfo			= (p_pfn_clGetCommandQueueInfo)			oclGetProcAddress(lib, "clGetCommandQueueInfo");
	pfn_clSetCommandQueueProperty		= (p_pfn_clSetCommandQueueProperty)		oclGetProcAddress(lib, "clSetCommandQueueProperty");
	pfn_clCreateBuffer					= (p_pfn_clCreateBuffer)				oclGetProcAddress(lib, "clCreateBuffer");
	pfn_clCreateImage2D					= (p_pfn_clCreateImage2D)				oclGetProcAddress(lib, "clCreateImage2D");
	pfn_clCreateImage3D					= (p_pfn_clCreateImage3D)				oclGetProcAddress(lib, "clCreateImage3D");
	pfn_clRetainMemObject				= (p_pfn_clRetainMemObject)				oclGetProcAddress(lib, "clRetainMemObject");
	pfn_clReleaseMemObject				= (p_pfn_clReleaseMemObject)			oclGetProcAddress(lib, "clReleaseMemObject");
	pfn_clGetSupportedImageFormats		= (p_pfn_clGetSupportedImageFormats)	oclGetProcAddress(lib, "clGetSupportedImageFormats");
	pfn_clGetMemObjectInfo				= (p_pfn_clGetMemObjectInfo)			oclGetProcAddress(lib, "clGetMemObjectInfo");
	pfn_clGetImageInfo					= (p_pfn_clGetImageInfo)				oclGetProcAddress(lib, "clGetImageInfo");
	pfn_clCreateSampler					= (p_pfn_clCreateSampler)				oclGetProcAddress(lib, "clCreateSampler");
	pfn_clRetainSampler					= (p_pfn_clRetainSampler)				oclGetProcAddress(lib, "clRetainSampler");
	pfn_clReleaseSampler				= (p_pfn_clReleaseSampler)				oclGetProcAddress(lib, "clReleaseSampler");
	pfn_clGetSamplerInfo				= (p_pfn_clGetSamplerInfo)				oclGetProcAddress(lib, "clGetSamplerInfo");
	pfn_clCreateProgramWithSource		= (p_pfn_clCreateProgramWithSource)		oclGetProcAddress(lib, "clCreateProgramWithSource");
	pfn_clCreateProgramWithBinary		= (p_pfn_clCreateProgramWithBinary)		oclGetProcAddress(lib, "clCreateProgramWithBinary");
	pfn_clRetainProgram					= (p_pfn_clRetainProgram)				oclGetProcAddress(lib, "clRetainProgram");
	pfn_clReleaseProgram				= (p_pfn_clReleaseProgram)				oclGetProcAddress(lib, "clReleaseProgram");
	pfn_clBuildProgram					= (p_pfn_clBuildProgram)				oclGetProcAddress(lib, "clBuildProgram");
	pfn_clUnloadCompiler				= (p_pfn_clUnloadCompiler)				oclGetProcAddress(lib, "clUnloadCompiler");
	pfn_clGetProgramInfo				= (p_pfn_clGetProgramInfo)				oclGetProcAddress(lib, "clGetProgramInfo");
	pfn_clGetProgramBuildInfo			= (p_pfn_clGetProgramBuildInfo)			oclGetProcAddress(lib, "clGetProgramBuildInfo");
	pfn_clCreateKernel					= (p_pfn_clCreateKernel)				oclGetProcAddress(lib, "clCreateKernel");
	pfn_clCreateKernelsInProgram		= (p_pfn_clCreateKernelsInProgram)		oclGetProcAddress(lib, "clCreateKernelsInProgram");
	pfn_clRetainKernel					= (p_pfn_clRetainKernel)				oclGetProcAddress(lib, "clRetainKernel");
	pfn_clReleaseKernel					= (p_pfn_clReleaseKernel)				oclGetProcAddress(lib, "clReleaseKernel");
	pfn_clSetKernelArg					= (p_pfn_clSetKernelArg)				oclGetProcAddress(lib, "clSetKernelArg");
	pfn_clGetKernelInfo					= (p_pfn_clGetKernelInfo)				oclGetProcAddress(lib, "clGetKernelInfo");
	pfn_clGetKernelWorkGroupInfo		= (p_pfn_clGetKernelWorkGroupInfo)		oclGetProcAddress(lib, "clGetKernelWorkGroupInfo");
	pfn_clWaitForEvents					= (p_pfn_clWaitForEvents)				oclGetProcAddress(lib, "clWaitForEvents");
	pfn_clGetEventInfo					= (p_pfn_clGetEventInfo)				oclGetProcAddress(lib, "clGetEventInfo");
	pfn_clRetainEvent					= (p_pfn_clRetainEvent)					oclGetProcAddress(lib, "clRetainEvent");
	pfn_clReleaseEvent					= (p_pfn_clReleaseEvent)				oclGetProcAddress(lib, "clReleaseEvent");
	pfn_clGetEventProfilingInfo			= (p_pfn_clGetEventProfilingInfo)		oclGetProcAddress(lib, "clGetEventProfilingInfo");
	pfn_clFlush							= (p_pfn_clFlush)						oclGetProcAddress(lib, "clFlush");
	pfn_clFinish						= (p_pfn_clFinish)						oclGetProcAddress(lib, "clFinish");
	pfn_clEnqueueReadBuffer				= (p_pfn_clEnqueueReadBuffer)			oclGetProcAddress(lib, "clEnqueueReadBuffer");
	pfn_clEnqueueReadBufferRect			= (p_pfn_clEnqueueReadBufferRect)		oclGetProcAddress(lib, "clEnqueueReadBufferRect");
	pfn_clEnqueueWriteBuffer			= (p_pfn_clEnqueueWriteBuffer)			oclGetProcAddress(lib, "clEnqueueWriteBuffer");
	pfn_clEnqueueWriteBufferRect		= (p_pfn_clEnqueueWriteBufferRect)		oclGetProcAddress(lib, "clEnqueueWriteBufferRect");
	pfn_clEnqueueCopyBuffer				= (p_pfn_clEnqueueCopyBuffer)			oclGetProcAddress(lib, "clEnqueueCopyBuffer");
	pfn_clEnqueueReadImage				= (p_pfn_clEnqueueReadImage)			oclGetProcAddress(lib, "clEnqueueReadImage");
	pfn_clEnqueueWriteImage				= (p_pfn_clEnqueueWriteImage)			oclGetProcAddress(lib, "clEnqueueWriteImage");
	pfn_clEnqueueCopyImage				= (p_pfn_clEnqueueCopyImage)			oclGetProcAddress(lib, "clEnqueueCopyImage");
	pfn_clEnqueueCopyImageToBuffer		= (p_pfn_clEnqueueCopyImageToBuffer)	oclGetProcAddress(lib, "clEnqueueCopyImageToBuffer");
	pfn_clEnqueueCopyBufferToImage		= (p_pfn_clEnqueueCopyBufferToImage)	oclGetProcAddress(lib, "clEnqueueCopyBufferToImage");
	pfn_clEnqueueMapBuffer				= (p_pfn_clEnqueueMapBuffer)			oclGetProcAddress(lib, "clEnqueueMapBuffer");
	pfn_clEnqueueMapImage				= (p_pfn_clEnqueueMapImage)				oclGetProcAddress(lib, "clEnqueueMapImage");
	pfn_clEnqueueUnmapMemObject			= (p_pfn_clEnqueueUnmapMemObject)		oclGetProcAddress(lib, "clEnqueueUnmapMemObject");
	pfn_clEnqueueNDRangeKernel			= (p_pfn_clEnqueueNDRangeKernel)		oclGetProcAddress(lib, "clEnqueueNDRangeKernel");
	pfn_clEnqueueTask					= (p_pfn_clEnqueueTask)					oclGetProcAddress(lib, "clEnqueueTask");
	pfn_clEnqueueNativeKernel			= (p_pfn_clEnqueueNativeKernel)			oclGetProcAddress(lib, "clEnqueueNativeKernel");
	pfn_clEnqueueMarker					= (p_pfn_clEnqueueMarker)				oclGetProcAddress(lib, "clEnqueueMarker");
	pfn_clEnqueueWaitForEvents			= (p_pfn_clEnqueueWaitForEvents)		oclGetProcAddress(lib, "clEnqueueWaitForEvents");
	pfn_clEnqueueBarrier				= (p_pfn_clEnqueueBarrier)				oclGetProcAddress(lib, "clEnqueueBarrier");
	pfn_clGetExtensionFunctionAddress	= (p_pfn_clGetExtensionFunctionAddress)	oclGetProcAddress(lib, "clGetExtensionFunctionAddress");

	return 1;
}